

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O3

void __thiscall
RTree::range_search_recursive
          (RTree *this,RTree_node *node,Polygon *query,
          vector<Polygon_*,_std::allocator<Polygon_*>_> *ans)

{
  pointer *pppPVar1;
  iterator __position;
  bool bVar2;
  Polygon **__args;
  long lVar3;
  long lVar4;
  
  if (node != (RTree_node *)0x0) {
    if (node->is_leaf == false) {
      if (0 < node->elements) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          bVar2 = Polygon::intersect_with_BB
                            (*(Polygon **)
                              ((long)&((node->data_internal_node).
                                       super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->region + lVar4),
                             query);
          if (bVar2) {
            range_search_recursive
                      (this,*(RTree_node **)
                             ((long)&((node->data_internal_node).
                                      super__Vector_base<d_internal_node,_std::allocator<d_internal_node>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->child + lVar4),
                       query,ans);
          }
          lVar3 = lVar3 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar3 < node->elements);
      }
    }
    else if (0 < node->elements) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        bVar2 = Polygon::is_Within_of
                          (*(Polygon **)
                            ((long)&((node->data_leafs).
                                     super__Vector_base<d_leaf,_std::allocator<d_leaf>_>._M_impl.
                                     super__Vector_impl_data._M_start)->region + lVar3),query);
        if (bVar2) {
          __args = (Polygon **)
                   ((long)&((node->data_leafs).super__Vector_base<d_leaf,_std::allocator<d_leaf>_>.
                            _M_impl.super__Vector_impl_data._M_start)->polygon + lVar3);
          __position._M_current =
               (ans->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (ans->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Polygon*,std::allocator<Polygon*>>::_M_realloc_insert<Polygon*const&>
                      ((vector<Polygon*,std::allocator<Polygon*>> *)ans,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            pppPVar1 = &(ans->super__Vector_base<Polygon_*,_std::allocator<Polygon_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppPVar1 = *pppPVar1 + 1;
          }
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (lVar4 < node->elements);
    }
  }
  return;
}

Assistant:

void RTree::range_search_recursive(RTree_node * node, Polygon & query, std::vector<Polygon *> & ans){
    if(node != nullptr){
        if(!node->is_leaf){
            for(int i = 0; i < node->elements;i++){
                if(node->data_internal_node[i].region->intersect_with_BB(query) ){
                    //ans.push_back(data_query_return(node->data_internal_node[i].region,node->get_level()));
                    range_search_recursive(node->data_internal_node[i].child,query,ans);
                }
            }
        }
        else{
            for(int i = 0; i < node->elements; i++){
                if(node->data_leafs[i].region->is_Within_of(query)){
                    ans.push_back(node->data_leafs[i].polygon);
                }
            }
        }
    }
}